

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int initiate_close(quicly_conn_t *conn,int err,uint64_t frame_type,char *reason_phrase)

{
  int iVar1;
  char *pcVar2;
  uint16_t uVar3;
  
  if (QUICLY_STATE_CONNECTED < (conn->super).state) {
    return 0;
  }
  pcVar2 = "";
  if (reason_phrase != (char *)0x0) {
    pcVar2 = reason_phrase;
  }
  if (err == 0) {
    frame_type = 0;
    uVar3 = 0;
  }
  else {
    if ((err & 0xffff0000U) == 0x30000) {
      frame_type = 0xffffffffffffffff;
    }
    else if ((err & 0xffff0000U) != 0x20000) {
      uVar3 = 1;
      if (0xff < (uint)err) goto LAB_00121371;
      err = err | 0x100;
    }
    uVar3 = (uint16_t)err;
  }
LAB_00121371:
  (conn->egress).connection_close.error_code = uVar3;
  (conn->egress).connection_close.frame_type = frame_type;
  (conn->egress).connection_close.reason_phrase = pcVar2;
  iVar1 = enter_close(conn,1,0);
  return iVar1;
}

Assistant:

int initiate_close(quicly_conn_t *conn, int err, uint64_t frame_type, const char *reason_phrase)
{
    uint16_t quic_error_code;

    if (conn->super.state >= QUICLY_STATE_CLOSING)
        return 0;

    if (reason_phrase == NULL)
        reason_phrase = "";

    /* convert error code to QUIC error codes */
    if (err == 0) {
        quic_error_code = 0;
        frame_type = QUICLY_FRAME_TYPE_PADDING;
    } else if (QUICLY_ERROR_IS_QUIC_TRANSPORT(err)) {
        quic_error_code = QUICLY_ERROR_GET_ERROR_CODE(err);
    } else if (QUICLY_ERROR_IS_QUIC_APPLICATION(err)) {
        quic_error_code = QUICLY_ERROR_GET_ERROR_CODE(err);
        frame_type = UINT64_MAX;
    } else if (PTLS_ERROR_GET_CLASS(err) == PTLS_ERROR_CLASS_SELF_ALERT) {
        quic_error_code = QUICLY_TRANSPORT_ERROR_TLS_ALERT_BASE + PTLS_ERROR_TO_ALERT(err);
    } else {
        quic_error_code = QUICLY_ERROR_GET_ERROR_CODE(QUICLY_TRANSPORT_ERROR_INTERNAL);
    }

    conn->egress.connection_close.error_code = quic_error_code;
    conn->egress.connection_close.frame_type = frame_type;
    conn->egress.connection_close.reason_phrase = reason_phrase;
    return enter_close(conn, 1, 0);
}